

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O2

void __thiscall
fizplex::Base::Base(Base *this,LP *lp,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *basic_indices)

{
  pointer puVar1;
  pointer puVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *__x;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  ETM local_50;
  
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->etms).super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DVector::DVector(&this->work,
                   (long)(basic_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(basic_indices->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3);
  this->m = (long)(basic_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(basic_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
  std::make_unique<unsigned_long[]>((size_t)&this->row_ordering);
  puVar1 = (basic_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (basic_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  sVar4 = LP::row_count(lp);
  if ((long)puVar2 - (long)puVar1 >> 3 == sVar4) {
    for (uVar6 = 0; uVar5 = this->m, uVar6 < uVar5; uVar6 = uVar6 + 1) {
      __x = &ColMatrix::column(&lp->A,(basic_indices->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar6])->values;
      std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::vector
                ((vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *)
                 &local_50,__x);
      local_50.col = uVar6;
      std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::
      emplace_back<fizplex::Base::ETM>(&this->etms,&local_50);
      std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
      ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                     *)&local_50);
    }
    puVar3 = (this->row_ordering)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    for (uVar6 = 0; uVar6 < uVar5; uVar6 = uVar6 + 1) {
      puVar3[uVar6] = uVar6;
      uVar5 = this->m;
    }
    invert(this);
    return;
  }
  __assert_fail("basic_indices.size() == lp.row_count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base.cc"
                ,0x13,"fizplex::Base::Base(const LP &, const std::vector<size_t> &)");
}

Assistant:

Base::Base(const LP &lp, const std::vector<size_t> &basic_indices)
    : work(basic_indices.size()), m(basic_indices.size()),
      row_ordering(std::make_unique<size_t[]>(m)) {
  assert(basic_indices.size() == lp.row_count());
  for (size_t i = 0; i < m; i++)
    etms.push_back(ETM(lp.A.column(basic_indices[i]), i));
  for (size_t i = 0; i < m; i++)
    row_ordering[i] = i;
  invert();
}